

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# izamax.c
# Opt level: O1

integer izamax_(integer *n,doublecomplex *zx,integer *incx)

{
  doublecomplex *z;
  int iVar1;
  integer iVar2;
  int iVar3;
  long lVar4;
  doublereal dVar5;
  double local_40;
  
  iVar2 = 0;
  if (((0 < *n) && (iVar1 = *incx, iVar2 = 0, 0 < iVar1)) && (iVar2 = 1, *n != 1)) {
    local_40 = dcabs1_(zx);
    if (iVar1 == 1) {
      if (1 < *n) {
        z = zx + 1;
        iVar2 = 1;
        lVar4 = 1;
        do {
          dVar5 = dcabs1_(z);
          if (local_40 < dVar5) {
            local_40 = dcabs1_(z);
            iVar2 = (int)lVar4 + 1;
          }
          lVar4 = lVar4 + 1;
          z = z + 1;
        } while (lVar4 < *n);
      }
    }
    else if (1 < *n) {
      iVar3 = *incx + 1;
      iVar1 = 1;
      iVar2 = 1;
      do {
        iVar1 = iVar1 + 1;
        dVar5 = dcabs1_(zx + (long)iVar3 + -1);
        if (local_40 < dVar5) {
          local_40 = dcabs1_(zx + (long)iVar3 + -1);
          iVar2 = iVar1;
        }
        iVar3 = iVar3 + *incx;
      } while (iVar1 < *n);
    }
  }
  return iVar2;
}

Assistant:

integer izamax_(integer *n, doublecomplex *zx, integer *incx)
{


    /* System generated locals */
integer ret_val, i__1;

    /* Local variables */
    doublereal smax;
    integer i;
    extern doublereal dcabs1_(doublecomplex *);
    integer ix;


/*     finds the index of element having max. absolute value.   
       jack dongarra, 1/15/85.   
       modified 3/93 to return if incx .le. 0.   
       modified 12/3/93, array(1) declarations changed to array(*)   


    
   Parameter adjustments   
       Function Body */
#define ZX(I) zx[(I)-1]


    ret_val = 0;
    if (*n < 1 || *incx <= 0) {
	return ret_val;
    }
    ret_val = 1;
    if (*n == 1) {
	return ret_val;
    }
    if (*incx == 1) {
	goto L20;
    }

/*        code for increment not equal to 1 */

    ix = 1;
    smax = dcabs1_(&ZX(1));
    ix += *incx;
    for (i = 2; i <= *n; ++i) {
	if (dcabs1_(&ZX(ix)) <= smax) {
	    goto L5;
	}
	ret_val = i;
	smax = dcabs1_(&ZX(ix));
L5:
	ix += *incx;
/* L10: */
    }
    return ret_val;

/*        code for increment equal to 1 */

L20:
    smax = dcabs1_(&ZX(1));
    for (i = 2; i <= *n; ++i) {
	if (dcabs1_(&ZX(i)) <= smax) {
	    goto L30;
	}
	ret_val = i;
	smax = dcabs1_(&ZX(i));
L30:
	;
    }
    return ret_val;
}